

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_block.cpp
# Opt level: O0

void __thiscall
cfd::core::MerkleBlock::TraverseAndBuild
          (MerkleBlock *this,uint64_t height,uint64_t pos,
          vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids,
          vector<bool,_std::allocator<bool>_> *matches)

{
  vector<bool,_std::allocator<bool>_> *pvVar1;
  const_reference cVar2;
  uint64_t height_00;
  uint64_t uVar3;
  long lVar4;
  bool bVar5;
  vector<bool,_std::allocator<bool>_> local_c0;
  vector<bool,_std::allocator<bool>_> local_98;
  Txid local_60;
  ulong local_40;
  uint64_t index;
  vector<bool,_std::allocator<bool>_> *pvStack_30;
  bool has_parent_of_match;
  vector<bool,_std::allocator<bool>_> *matches_local;
  vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *txids_local;
  uint64_t pos_local;
  uint64_t height_local;
  MerkleBlock *this_local;
  
  index._7_1_ = 0;
  local_40 = pos << ((byte)height & 0x3f);
  pvStack_30 = matches;
  matches_local = (vector<bool,_std::allocator<bool>_> *)txids;
  txids_local = (vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)pos;
  pos_local = height;
  height_local = (uint64_t)this;
  while( true ) {
    bVar5 = false;
    if (local_40 <
        (ulong)((long)((long)&(txids_local->
                              super__Vector_base<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>)
                              ._M_impl.super__Vector_impl_data._M_start + 1) <<
               ((byte)pos_local & 0x3f))) {
      bVar5 = local_40 < this->transaction_count;
    }
    if (!bVar5) goto LAB_0052a601;
    cVar2 = ::std::vector<bool,_std::allocator<bool>_>::operator[](matches,local_40);
    if (cVar2) break;
    local_40 = local_40 + 1;
  }
  index._7_1_ = 1;
LAB_0052a601:
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)&this->bits_,(bool)(index._7_1_ & 1));
  pvVar1 = matches_local;
  if ((pos_local == 0) || ((index._7_1_ & 1) == 0)) {
    CalculateHash(&local_60,this,pos_local,(uint64_t)txids_local,
                  (vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)matches_local);
    ::std::vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_>::push_back
              (&this->txids_,&local_60);
    Txid::~Txid(&local_60);
  }
  else {
    height_00 = pos_local - 1;
    uVar3 = (long)txids_local * 2;
    ::std::vector<bool,_std::allocator<bool>_>::vector(&local_98,matches);
    TraverseAndBuild(this,height_00,uVar3,
                     (vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)pvVar1,&local_98);
    ::std::vector<bool,_std::allocator<bool>_>::~vector(&local_98);
    lVar4 = (long)txids_local * 2;
    uVar3 = CalcTreeWidth(this->transaction_count,pos_local - 1);
    pvVar1 = matches_local;
    if (lVar4 + 1U < uVar3) {
      uVar3 = pos_local - 1;
      lVar4 = (long)txids_local * 2;
      ::std::vector<bool,_std::allocator<bool>_>::vector(&local_c0,matches);
      TraverseAndBuild(this,uVar3,lVar4 + 1,
                       (vector<cfd::core::Txid,_std::allocator<cfd::core::Txid>_> *)pvVar1,&local_c0
                      );
      ::std::vector<bool,_std::allocator<bool>_>::~vector(&local_c0);
    }
  }
  return;
}

Assistant:

void MerkleBlock::TraverseAndBuild(
    uint64_t height, uint64_t pos, const std::vector<Txid>& txids,
    const std::vector<bool> matches) {
  bool has_parent_of_match = false;
  for (uint64_t index = pos << height;
       (index < ((pos + 1) << height)) && (index < transaction_count);
       ++index) {
    if (matches[index]) {
      has_parent_of_match = true;
      break;
    }
  }
  bits_.push_back(has_parent_of_match);
  if ((height == 0) || (!has_parent_of_match)) {
    // if at height 0, or nothing interesting below, store hash and stop
    txids_.push_back(CalculateHash(height, pos, txids));
  } else {
    TraverseAndBuild(height - 1, pos * 2, txids, matches);
    if ((pos * 2 + 1) < CalcTreeWidth(transaction_count, height - 1)) {
      TraverseAndBuild(height - 1, pos * 2 + 1, txids, matches);
    }
  }
}